

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_film_grain_table(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  av1_extracfg *extra_cfg_00;
  aom_codec_alg_priv_t_conflict *in_RSI;
  long in_RDI;
  aom_codec_err_t ret;
  char *str;
  av1_extracfg extra_cfg;
  undefined4 in_stack_fffffffffffffd84;
  undefined1 local_270 [272];
  undefined8 local_160;
  aom_codec_alg_priv_t_conflict *local_18;
  
  local_18 = in_RSI;
  memcpy(local_270,(void *)(in_RDI + 0x458),600);
  uVar1 = *(uint *)&(local_18->base).err_detail;
  if (uVar1 < 0x29) {
    extra_cfg_00 = (av1_extracfg *)
                   ((long)(int)uVar1 + (long)(local_18->base).enc.cx_data_dst_buf.buf);
    *(uint *)&(local_18->base).err_detail = uVar1 + 8;
  }
  else {
    extra_cfg_00 = (av1_extracfg *)(local_18->base).init_flags;
    (local_18->base).init_flags = (aom_codec_flags_t)&extra_cfg_00->enable_auto_bwd_ref;
  }
  if (*(char **)extra_cfg_00 == (char *)0x0) {
    local_160 = 0;
  }
  else {
    aVar2 = allocate_and_set_string
                      (*(char **)extra_cfg_00,(char *)CONCAT44(in_stack_fffffffffffffd84,uVar1),
                       (char **)local_18,(char *)extra_cfg_00);
    if (aVar2 != AOM_CODEC_OK) {
      return aVar2;
    }
  }
  aVar2 = update_extra_cfg(local_18,extra_cfg_00);
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_film_grain_table(aom_codec_alg_priv_t *ctx,
                                                 va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  const char *str = CAST(AV1E_SET_FILM_GRAIN_TABLE, args);
  if (str == NULL) {
    // this parameter allows NULL as its value
    extra_cfg.film_grain_table_filename = str;
  } else {
#if CONFIG_REALTIME_ONLY
    ERROR("film_grain removed from realtime only build.");
#endif
    const aom_codec_err_t ret = allocate_and_set_string(
        str, default_extra_cfg.film_grain_table_filename,
        &extra_cfg.film_grain_table_filename, ctx->ppi->error.detail);
    if (ret != AOM_CODEC_OK) return ret;
  }
  return update_extra_cfg(ctx, &extra_cfg);
}